

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O3

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preBegin__fog_coord_src
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  xmlChar **ppxVar1;
  ParserChar *additionalText;
  bool bVar2;
  undefined8 *puVar3;
  StringHash SVar4;
  undefined8 *puVar5;
  ParserChar *text;
  bool local_39;
  undefined8 *local_38;
  
  puVar3 = (undefined8 *)
           GeneratedSaxParser::StackMemoryManager::newObject
                     (&(this->
                       super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                       ).super_ParserTemplateBase.mStackMemoryManager,0x10);
  *puVar3 = 0;
  puVar3[1] = 0;
  *attributeDataPtr = puVar3;
  ppxVar1 = attributes->attributes;
  if ((ppxVar1 != (xmlChar **)0x0) && (text = *ppxVar1, text != (ParserChar *)0x0)) {
    local_38 = &DAT_00836e00;
    do {
      SVar4 = GeneratedSaxParser::Utils::calculateStringHash(text);
      additionalText = ppxVar1[1];
      if (SVar4 == 0x76887d) {
        puVar3[1] = additionalText;
      }
      else {
        if (SVar4 == 0x7c83b5) {
          SVar4 = GeneratedSaxParser::Utils::calculateStringHash(additionalText,&local_39);
          puVar5 = &ENUM__gl_fog_coord_src_enumMap;
          if ((SVar4 == 0x55fae75) || (puVar5 = local_38, SVar4 == 0x64bb18)) {
            *(undefined4 *)puVar3 = *(undefined4 *)(puVar5 + 1);
            goto LAB_007157f1;
          }
          local_39 = true;
          *(undefined4 *)puVar3 = 2;
          bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                            ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                             ERROR_ATTRIBUTE_PARSING_FAILED,0xbd530c3,0x7c83b5,additionalText);
        }
        else {
          bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                            ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                             ERROR_UNKNOWN_ATTRIBUTE,0xbd530c3,text,additionalText);
        }
        if (bVar2 != false) {
          return false;
        }
      }
LAB_007157f1:
      text = ppxVar1[2];
      ppxVar1 = ppxVar1 + 2;
    } while (text != (ParserChar *)0x0);
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__fog_coord_src( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__fog_coord_src( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

fog_coord_src__AttributeData* attributeData = newData<fog_coord_src__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_VALUE:
    {
bool failed;
attributeData->value = Utils::toEnum<ENUM__gl_fog_coord_src_enum, StringHash, ENUM__gl_fog_coord_src_enum__COUNT>(attributeValue, failed, ENUM__gl_fog_coord_src_enumMap, Utils::calculateStringHash);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_FOG_COORD_SRC,
        HASH_ATTRIBUTE_VALUE,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_PARAM:
    {

attributeData->param = attributeValue;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NCName(attributeData->param, strlen(attributeData->param));
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_FOG_COORD_SRC,
            HASH_ATTRIBUTE_PARAM,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_FOG_COORD_SRC, attribute, attributeValue))
            {return false;}
    }
    }
    }
}


    return true;
}